

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::ReadData
          (ColumnReader *this,idx_t read_now,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result,idx_t result_offset)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  uint8_t *defines;
  idx_t iVar7;
  idx_t idx_in_entry;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  ColumnReader *local_40;
  unsigned_long local_38;
  
  if ((result_offset != 0) && (*result != (Vector)0x0)) {
    duckdb::Vector::Flatten((ulong)result);
    duckdb::Vector::Resize((ulong)result,result_offset);
  }
  local_40 = this;
  if (this->page_is_filtered_out == true) {
    FlatVector::VerifyFlatVector(result);
    if (read_now != 0) {
      _Var6._M_head_impl = *(unsigned_long **)(result + 0x28);
      iVar7 = read_now;
      do {
        if (_Var6._M_head_impl == (unsigned_long *)0x0) {
          local_38 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var3 = p_Stack_50;
          uVar2 = local_58;
          local_58 = 0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar2;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var3;
          if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              (result + 0x30));
          _Var6._M_head_impl =
               (pTVar5->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var6._M_head_impl;
        }
        bVar1 = (byte)result_offset & 0x3f;
        _Var6._M_head_impl[result_offset >> 6] =
             _Var6._M_head_impl[result_offset >> 6] &
             (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
        result_offset = result_offset + 1;
        iVar7 = iVar7 - 1;
      } while (iVar7 != 0);
    }
  }
  else {
    bVar4 = PrepareRead(this,read_now,define_out,repeat_out,result_offset);
    defines = (uint8_t *)0x0;
    if (!bVar4) {
      defines = define_out;
    }
    switch(this->encoding) {
    case DICTIONARY:
      DictionaryDecoder::Read(&this->dictionary_decoder,defines,read_now,result,result_offset);
      break;
    case DELTA_BINARY_PACKED:
      DeltaBinaryPackedDecoder::Read
                (&this->delta_binary_packed_decoder,defines,read_now,result,result_offset);
      break;
    case RLE:
      RLEDecoder::Read(&this->rle_decoder,defines,read_now,result,result_offset);
      break;
    case DELTA_LENGTH_BYTE_ARRAY:
      DeltaLengthByteArrayDecoder::Read
                (&this->delta_length_byte_array_decoder,&this->block,defines,read_now,result,
                 result_offset);
      break;
    case DELTA_BYTE_ARRAY:
      DeltaByteArrayDecoder::Read
                (&this->delta_byte_array_decoder,defines,read_now,result,result_offset);
      break;
    case BYTE_STREAM_SPLIT:
      ByteStreamSplitDecoder::Read
                (&this->byte_stream_split_decoder,defines,read_now,result,result_offset);
      break;
    default:
      (*this->_vptr_ColumnReader[0xf])(this,&this->block,defines,read_now,result_offset,result);
    }
  }
  local_40->page_rows_available = local_40->page_rows_available - read_now;
  return;
}

Assistant:

void ColumnReader::ReadData(idx_t read_now, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result,
                            idx_t result_offset) {
	// flatten the result vector if required
	if (result_offset != 0 && result.GetVectorType() != VectorType::FLAT_VECTOR) {
		result.Flatten(result_offset);
		result.Resize(result_offset, STANDARD_VECTOR_SIZE);
	}
	if (page_is_filtered_out) {
		// page is filtered out - emit NULL for any rows
		auto &validity = FlatVector::Validity(result);
		for (idx_t i = 0; i < read_now; i++) {
			validity.SetInvalid(result_offset + i);
		}
		page_rows_available -= read_now;
		return;
	}
	// read the defines/repeats
	const auto all_valid = PrepareRead(read_now, define_out, repeat_out, result_offset);
	// read the data according to the encoder
	const auto define_ptr = all_valid ? nullptr : static_cast<uint8_t *>(define_out);
	switch (encoding) {
	case ColumnEncoding::DICTIONARY:
		dictionary_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::DELTA_BINARY_PACKED:
		delta_binary_packed_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::RLE:
		rle_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::DELTA_LENGTH_BYTE_ARRAY:
		delta_length_byte_array_decoder.Read(block, define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::DELTA_BYTE_ARRAY:
		delta_byte_array_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::BYTE_STREAM_SPLIT:
		byte_stream_split_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	default:
		Plain(block, define_ptr, read_now, result_offset, result);
		break;
	}
	page_rows_available -= read_now;
}